

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int bmcg_sat_solver_quantify_test
              (bmcg_sat_solver **pSats,Gia_Man_t *p,int iLit,int fHash,
              _func_int_void_ptr_int *pFuncCiToKeep,void *pData,Vec_Int_t *vDLits)

{
  int iLit0;
  int iLit1;
  int iVar1;
  bmcg_sat_solver *pSat_00;
  bmcg_sat_solver *pSat;
  int Res2;
  int Res1;
  void *pData_local;
  _func_int_void_ptr_int *pFuncCiToKeep_local;
  int fHash_local;
  int iLit_local;
  Gia_Man_t *p_local;
  bmcg_sat_solver **pSats_local;
  
  iLit0 = Gia_ManQuantExist(p,iLit,pFuncCiToKeep,pData);
  iLit1 = bmcg_sat_solver_quantify2(p,iLit,1,pFuncCiToKeep,pData,(Vec_Int_t *)0x0);
  pSat_00 = bmcg_sat_solver_start();
  iVar1 = bmcg_sat_solver_equiv_overlap_check(pSat_00,p,iLit0,iLit1,1);
  if (iVar1 == 0) {
    printf("Verification FAILED.\n");
    bmcg_sat_solver_print_sop_lit(p,iLit0);
    bmcg_sat_solver_print_sop_lit(p,iLit1);
    printf("\n");
  }
  else {
    printf("Verification passed.\n");
  }
  return iLit0;
}

Assistant:

int bmcg_sat_solver_quantify_test( bmcg_sat_solver * pSats[], Gia_Man_t * p, int iLit, int fHash, int(*pFuncCiToKeep)(void *, int), void * pData, Vec_Int_t * vDLits )
{
    extern int Gia_ManQuantExist( Gia_Man_t * p, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData );
    int Res1 = Gia_ManQuantExist( p, iLit, pFuncCiToKeep, pData );
    int Res2 = bmcg_sat_solver_quantify2( p, iLit, 1, pFuncCiToKeep, pData, NULL );

    bmcg_sat_solver * pSat = bmcg_sat_solver_start();
    if ( bmcg_sat_solver_equiv_overlap_check( pSat, p, Res1, Res2, 1 ) )
        printf( "Verification passed.\n" );
    else
    {
        printf( "Verification FAILED.\n" );
        bmcg_sat_solver_print_sop_lit( p, Res1 );
        bmcg_sat_solver_print_sop_lit( p, Res2 );
        printf( "\n" );
    }
    return Res1;
}